

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O2

void __thiscall
LinuxEvents<0>::LinuxEvents(LinuxEvents<0> *this,vector<int,_std::allocator<int>_> *config_vec)

{
  int __fd;
  long lVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [32];
  allocator local_71;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  perf_event_attr *local_60;
  int *local_58;
  string local_50;
  
  local_70 = &this->temp_result_vec;
  this->fd = 0;
  this->working = true;
  local_68 = &this->ids;
  (this->attribs).type = 0;
  (this->attribs).size = 0;
  (this->attribs).config = 0;
  (this->attribs).field_3.sample_period = 0;
  (this->attribs).sample_type = 0;
  (this->attribs).read_format = 0;
  *(undefined8 *)&(this->attribs).field_0x28 = 0;
  (this->attribs).field_44 = (anon_union_4_2_10a424aa_for_perf_event_attr_45)0x0;
  (this->attribs).bp_type = 0;
  (this->attribs).field_46.bp_addr = 0;
  (this->attribs).field_47.bp_len = 0;
  (this->attribs).branch_sample_type = 0;
  (this->attribs).sample_regs_user = 0;
  (this->attribs).sample_stack_user = 0;
  (this->attribs).clockid = 0;
  (this->attribs).sample_regs_intr = 0;
  (this->attribs).aux_watermark = 0;
  (this->attribs).sample_max_stack = 0;
  (this->attribs).__reserved_2 = 0;
  (this->attribs).aux_sample_size = 0;
  (this->attribs).__reserved_3 = 0;
  (this->attribs).sig_data = 0;
  local_60 = &this->attribs;
  auVar5 = ZEXT432(0) << 0x40;
  this->temp_result_vec = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar5._0_24_;
  (this->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar5._24_8_;
  *(undefined1 (*) [32])
   &(this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar5;
  (this->attribs).size = 0x80;
  *(undefined8 *)&(this->attribs).field_0x28 = 0x61;
  (this->attribs).read_format = 0xc;
  piVar2 = (config_vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = (config_vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  this->num_events = (int)((ulong)((long)local_58 - (long)piVar2) >> 2);
  uVar3 = 0xffffffff;
  uVar4 = 0;
  for (; piVar2 != local_58; piVar2 = piVar2 + 1) {
    (this->attribs).config = (long)*piVar2;
    lVar1 = syscall(0x12a,local_60,0,0xffffffffffffffff,(ulong)uVar3,0);
    __fd = (int)lVar1;
    this->fd = __fd;
    if (__fd == -1) {
      std::__cxx11::string::string((string *)&local_50,"perf_event_open",&local_71);
      report_error(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      __fd = this->fd;
    }
    ioctl(__fd,0x80082407,
          (this->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + uVar4);
    if (uVar3 == 0xffffffff) {
      uVar3 = this->fd;
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_70,(long)this->num_events * 2 + 1);
  return;
}

Assistant:

explicit LinuxEvents(std::vector<int> config_vec) : fd(0), working(true) {
    memset(&attribs, 0, sizeof(attribs));
    attribs.type = TYPE;
    attribs.size = sizeof(attribs);
    attribs.disabled = 1;
    attribs.exclude_kernel = 1;
    attribs.exclude_hv = 1;

    attribs.sample_period = 0;
    attribs.read_format = PERF_FORMAT_GROUP | PERF_FORMAT_ID;
    const int pid = 0;  // the current process
    const int cpu = -1; // all CPUs
    const unsigned long flags = 0;

    int group = -1; // no group
    num_events = config_vec.size();
    uint32_t i = 0;
    for (auto config : config_vec) {
      attribs.config = config;
      fd = syscall(__NR_perf_event_open, &attribs, pid, cpu, group, flags);
      if (fd == -1) {
        report_error("perf_event_open");
      }
      ioctl(fd, PERF_EVENT_IOC_ID, &ids[i++]);
      if (group == -1) {
        group = fd;
      }
    }

    temp_result_vec.resize(num_events * 2 + 1);
  }